

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitSum
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,SumExpr e)

{
  int iVar1;
  long lVar2;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  value.size_ = 1;
  value.data_ = "(";
  fmt::BasicWriter<char>::operator<<(this->writer_,value);
  iVar1 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                         impl_ + 4);
  if ((long)iVar1 != 0) {
    Visit(this,(NumericExpr)
               ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_
               + 8))->impl_,-1);
    for (lVar2 = 0; (long)iVar1 * 8 + -8 != lVar2; lVar2 = lVar2 + 8) {
      value_00.size_ = 3;
      value_00.data_ = " + ";
      fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
      Visit(this,(NumericExpr)
                 ((ExprBase *)
                 ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                        impl_ + 0x10 + lVar2))->impl_,-1);
    }
  }
  fmt::BasicWriter<char>::operator<<(this->writer_,')');
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitSum(SumExpr e) {
  writer_ << "(";
  typename SumExpr::iterator i = e.begin(), end = e.end();
  if (i != end) {
    Visit(*i);
    for (++i; i != end; ++i) {
      writer_ << " + ";
      Visit(*i);
    }
  }
  writer_ << ')';
}